

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnGlobalSet(SharedValidator *this,Location *loc,Var *global_var)

{
  Result RVar1;
  char *pcVar2;
  int __c;
  Var local_80;
  Enum local_34;
  GlobalType local_30;
  GlobalType global_type;
  Var *global_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  global_type = (GlobalType)global_var;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  GlobalType::GlobalType(&local_30);
  Var::Var(&local_80,global_var);
  local_34 = (Enum)CheckGlobalIndex(this,&local_80,&local_30);
  pcVar2 = (char *)(ulong)local_34;
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_34);
  Var::~Var(&local_80);
  if ((local_30.mutable_ & 1U) == 0) {
    pcVar2 = Var::index(global_var,pcVar2,__c);
    RVar1 = PrintError(this,loc,"can\'t global.set on immutable global at index %u.",
                       (ulong)pcVar2 & 0xffffffff);
    Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  }
  this->expr_loc_ = loc;
  RVar1 = TypeChecker::OnGlobalSet(&this->typechecker_,local_30.type);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnGlobalSet(const Location& loc, Var global_var) {
  Result result = Result::Ok;
  GlobalType global_type;
  result |= CheckGlobalIndex(global_var, &global_type);
  if (!global_type.mutable_) {
    result |= PrintError(
        loc, "can't global.set on immutable global at index %" PRIindex ".",
        global_var.index());
  }
  expr_loc_ = &loc;
  result |= typechecker_.OnGlobalSet(global_type.type);
  return result;
}